

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.c
# Opt level: O0

void finish_quest(obj *obj)

{
  obj *poVar1;
  int msgnum;
  obj *otmp;
  obj *obj_local;
  
  if ((u.uhave._0_1_ & 1) == 0) {
    msgnum = 0x52;
    if (((uint)quest_status._0_4_ >> 0x13 & 1) == 0) {
      msgnum = 0x51;
    }
    qt_pager(msgnum);
    poVar1 = carrying(0x10c);
    if (poVar1 == (obj *)0x0) {
      com_pager(5);
    }
  }
  else {
    qt_pager(0x5b);
    poVar1 = carrying(0xd9);
    if (poVar1 != (obj *)0x0) {
      fully_identify_obj(poVar1);
    }
  }
  quest_status._0_4_ = quest_status._0_4_ & 0xfff7ffff | 0x80000;
  if (obj != (obj *)0x0) {
    u.uevent._0_2_ = u.uevent._0_2_ & 0xffdf | 0x20;
    historic_event('\0',"completed the quest!");
    fully_identify_obj(obj);
    update_inventory();
  }
  return;
}

Assistant:

void finish_quest(struct obj *obj)
{
	struct obj *otmp;

	if (u.uhave.amulet) {	/* unlikely but not impossible */
	    qt_pager(QT_HASAMULET);
	    /* leader IDs the real amulet but ignores any fakes */
	    if ((otmp = carrying(AMULET_OF_YENDOR)) != 0)
		fully_identify_obj(otmp);
	} else {
	    qt_pager(!Qstat(got_thanks) ? QT_OFFEREDIT : QT_OFFEREDIT2);
	    /* should have obtained bell during quest;
	       if not, suggest returning for it now */
	    if ((otmp = carrying(BELL_OF_OPENING)) == 0)
		com_pager(5);
	}
	Qstat(got_thanks) = TRUE;

	if (obj) {
	    u.uevent.qcompleted = 1;	/* you did it! */
	    historic_event(FALSE, "completed the quest!");
	    /* behave as if leader imparts sufficient info about the
	       quest artifact */
	    fully_identify_obj(obj);
	    update_inventory();
	}
}